

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O2

ptr<snapshot> __thiscall cornerstone::snapshot::deserialize(snapshot *this,buffer *buf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<snapshot> pVar1;
  ptr<cluster_config> conf;
  ulong size;
  ulong last_log_term;
  ulong last_log_idx;
  cluster_config cStack_58;
  
  cStack_58.servers_.
  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ._M_impl._M_node._M_size = buffer::get_ulong(buf);
  cStack_58.servers_.
  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)buffer::get_ulong(buf);
  cStack_58.servers_.
  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)buffer::get_ulong(buf);
  cluster_config::deserialize(&cStack_58,buf);
  std::
  make_shared<cornerstone::snapshot,unsigned_long&,unsigned_long&,std::shared_ptr<cornerstone::cluster_config>&,unsigned_long&>
            (&this->last_log_idx_,
             &cStack_58.servers_.
              super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
              ._M_impl._M_node._M_size,
             (shared_ptr<cornerstone::cluster_config> *)
             ((long)&cStack_58.servers_.
                     super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                     ._M_impl._M_node.super__List_node_base + 8),&cStack_58.log_idx_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cStack_58.prev_log_idx_);
  pVar1.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<snapshot>)pVar1.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> snapshot::deserialize(buffer& buf)
{
    ulong last_log_idx = buf.get_ulong();
    ulong last_log_term = buf.get_ulong();
    ulong size = buf.get_ulong();
    ptr<cluster_config> conf(cluster_config::deserialize(buf));
    return cs_new<snapshot>(last_log_idx, last_log_term, conf, size);
}